

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_name_macro_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f5a628::ns::book2a::book2a
          (book2a *this,string *author,string *title,double price)

{
  pointer pcVar1;
  
  *(book2a **)this = this + 0x10;
  pcVar1 = (author->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + author->_M_string_length)
  ;
  *(book2a **)(this + 0x20) = this + 0x30;
  pcVar1 = (title->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(this + 0x20),pcVar1,pcVar1 + title->_M_string_length);
  *(double *)(this + 0x40) = price;
  return;
}

Assistant:

book2a(const std::string& author,
              const std::string& title,
              double price)
            : author_(author), title_(title), price_(price)
        {
        }